

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_last.c
# Opt level: O3

int mpt_path_last(mpt_path *path)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = path->len;
  if ((uVar3 != 0) && (pcVar2 = path->base, pcVar2 != (char *)0x0)) {
    if (-1 < (char)path->flags) {
      uVar3 = uVar3 - 1;
      if (uVar3 == 0) {
        uVar5 = 0;
      }
      else {
        uVar6 = uVar3;
        uVar7 = 0;
        do {
          uVar5 = uVar7;
          if (pcVar2[uVar6 - 1] == path->sep) goto LAB_0010e25a;
          uVar7 = uVar5 + 1;
          uVar6 = uVar6 - 1;
          uVar5 = uVar3;
        } while (uVar6 != 0);
      }
      uVar6 = 0;
LAB_0010e25a:
      path->off = path->off + uVar6;
      path->first = (uint8_t)uVar5;
      path->len = (uVar5 & 0xff) + 1;
      return (int)uVar5;
    }
    if (uVar3 != 1) {
      bVar1 = pcVar2[uVar3 - 2];
      if ((ulong)(long)(char)bVar1 <= uVar3) {
        path->off = path->off + (uVar3 - (long)(char)bVar1);
        path->first = bVar1;
        path->len = (ulong)bVar1 + 2;
        return (int)(char)bVar1;
      }
    }
  }
  piVar4 = __errno_location();
  *piVar4 = 0x16;
  return -2;
}

Assistant:

extern int mpt_path_last(MPT_STRUCT(path) *path)
{
	const char *data;
	size_t len, pos;
	
	if (!(pos = path->len) || !(data = path->base)) {
		errno = EINVAL; return -2;
	}
	if (path->flags & MPT_PATHFLAG(SepBinary)) {
		if (pos < 2 || pos < (len = data[pos-2])) {
			errno = EINVAL; return -2;
		}
		pos -= len;
		
		path->off += pos;
		path->len  = (path->first = len) + 2;
		
		return len;
	}
	
	data += (--pos - 1);
	len = 0;
	
	/* find last separator */
	while (pos && *data != path->sep) {
		--data; ++len; --pos;
	}
	path->off += pos;
	path->len  = (path->first = len) + 1;
	
	return len;
}